

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  uint flags_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  char *text_end;
  ImGuiPayload *pIVar11;
  char *text;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float item_width;
  float local_2b4;
  bool local_2a1;
  float local_264;
  int local_260;
  float local_254;
  float local_244;
  ImGuiPayload *payload_1;
  ImGuiPayload *payload;
  int n_1;
  ImGuiColorEditFlags picker_flags;
  ImGuiColorEditFlags picker_flags_to_forward;
  ImVec2 local_218;
  ImVec2 local_210;
  ImVec2 local_208;
  ImVec2 local_200;
  undefined1 auStack_1f8 [8];
  ImVec4 col_v4;
  ImGuiWindow *picker_active_window;
  char *p;
  char buf [64];
  float local_190;
  int n;
  int fmt_idx;
  char *fmt_table_float [3] [4];
  char *fmt_table_int [3] [4];
  char *ids [4];
  float local_a0;
  bool hide_prefix;
  float w_item_last;
  float w_item_one;
  bool value_changed_as_float;
  int iStack_84;
  bool value_changed;
  int i [4];
  float f [4];
  int components;
  bool hdr;
  bool alpha;
  ImGuiColorEditFlags flags_untouched;
  char *label_display_end;
  float w_items_all;
  float w_extra;
  float square_sz;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar10 = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((pIVar10->SkipItems & 1U) == 0) {
    fVar14 = GetFrameHeight();
    if ((flags & 0x10U) == 0) {
      local_244 = fVar14 + (pIVar3->Style).ItemInnerSpacing.x;
    }
    else {
      local_244 = 0.0;
    }
    fVar15 = CalcItemWidth();
    fVar15 = fVar15 - local_244;
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    BeginGroup();
    PushID(label);
    window._4_4_ = flags;
    if ((flags & 0x20U) != 0) {
      window._4_4_ = flags & 0xff8fffffU | 0x100008;
    }
    if ((window._4_4_ & 8) == 0) {
      ColorEditOptionsPopup(col,window._4_4_);
    }
    if ((window._4_4_ & 0x700000) == 0) {
      window._4_4_ = pIVar3->ColorEditOptions & 0x700000U | window._4_4_;
    }
    if ((window._4_4_ & 0x1800000) == 0) {
      window._4_4_ = pIVar3->ColorEditOptions & 0x1800000U | window._4_4_;
    }
    if ((window._4_4_ & 0x6000000) == 0) {
      window._4_4_ = pIVar3->ColorEditOptions & 0x6000000U | window._4_4_;
    }
    flags_00 = pIVar3->ColorEditOptions & 0xf80fffffU | window._4_4_;
    bVar12 = (flags_00 & 2) == 0;
    bVar13 = (flags_00 & 0x80000) != 0;
    f[3] = 4.2039e-45;
    if (bVar12) {
      f[3] = 5.60519e-45;
    }
    i[2] = (int)*col;
    i[3] = (int)col[1];
    f[0] = col[2];
    if (bVar12) {
      local_254 = col[3];
    }
    else {
      local_254 = 1.0;
    }
    f[1] = local_254;
    if ((window._4_4_ & 0x200000) != 0) {
      ColorConvertRGBtoHSV(*col,col[1],col[2],(float *)(i + 2),(float *)(i + 3),f);
    }
    w_item_one = (float)(int)((float)i[2] * 255.0 +
                             (float)(~-(uint)(0.0 <= (float)i[2]) & 0xbf000000 |
                                    -(uint)(0.0 <= (float)i[2]) & 0x3f000000));
    iStack_84 = (int)((float)i[3] * 255.0 +
                     (float)(~-(uint)(0.0 <= (float)i[3]) & 0xbf000000 |
                            -(uint)(0.0 <= (float)i[3]) & 0x3f000000));
    i[0] = (int)(f[0] * 255.0 +
                (float)(~-(uint)(0.0 <= f[0]) & 0xbf000000 | -(uint)(0.0 <= f[0]) & 0x3f000000));
    i[1] = (int)(f[1] * 255.0 +
                (float)(~-(uint)(0.0 <= f[1]) & 0xbf000000 | -(uint)(0.0 <= f[1]) & 0x3f000000));
    label_local._7_1_ = false;
    bVar4 = false;
    if (((window._4_4_ & 0x300000) == 0) || ((flags_00 & 0x20) != 0)) {
      if (((window._4_4_ & 0x400000) != 0) && ((flags_00 & 0x20) == 0)) {
        if (bVar12) {
          uVar6 = ImClamp<int>((int)w_item_one,0,0xff);
          uVar7 = ImClamp<int>(iStack_84,0,0xff);
          uVar8 = ImClamp<int>(i[0],0,0xff);
          iVar9 = ImClamp<int>(i[1],0,0xff);
          ImFormatString((char *)&p,0x40,"#%02X%02X%02X%02X",(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,
                         iVar9);
        }
        else {
          uVar6 = ImClamp<int>((int)w_item_one,0,0xff);
          uVar7 = ImClamp<int>(iStack_84,0,0xff);
          uVar8 = ImClamp<int>(i[0],0,0xff);
          ImFormatString((char *)&p,0x40,"#%02X%02X%02X",(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
        }
        PushItemWidth(fVar15);
        bVar13 = InputText("##Text",(char *)&p,0x40,6,(ImGuiTextEditCallback)0x0,(void *)0x0);
        if (bVar13) {
          label_local._7_1_ = true;
          picker_active_window = (ImGuiWindow *)&p;
          while( true ) {
            local_2a1 = true;
            if (*(char *)&picker_active_window->Name != '#') {
              local_2a1 = ImCharIsBlankA(*(char *)&picker_active_window->Name);
            }
            if (local_2a1 == false) break;
            picker_active_window = (ImGuiWindow *)((long)&picker_active_window->Name + 1);
          }
          i[1] = 0;
          i[0] = 0;
          iStack_84 = 0;
          w_item_one = 0.0;
          if (bVar12) {
            __isoc99_sscanf(picker_active_window,"%02X%02X%02X%02X",&w_item_one,
                            &stack0xffffffffffffff7c,i,i + 1);
          }
          else {
            __isoc99_sscanf(picker_active_window,"%02X%02X%02X",&w_item_one,&stack0xffffffffffffff7c
                            ,i);
          }
        }
        if ((flags_00 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        PopItemWidth();
      }
    }
    else {
      item_width = ImMax<float>(1.0,(float)(int)((fVar15 - (pIVar3->Style).ItemInnerSpacing.x *
                                                           (float)((int)f[3] + -1)) /
                                                (float)(int)f[3]));
      fVar15 = ImMax<float>(1.0,(float)(int)(fVar15 - (item_width +
                                                      (pIVar3->Style).ItemInnerSpacing.x) *
                                                      (float)((int)f[3] + -1)));
      text = "M:000";
      if ((window._4_4_ & 0x1000000) != 0) {
        text = "M:0.000";
      }
      IVar2 = CalcTextSize(text,(char *)0x0,false,-1.0);
      local_a0 = IVar2.x;
      memcpy(fmt_table_float[2] + 3,&DAT_0026fca0,0x60);
      memcpy(&n,&DAT_0026fd00,0x60);
      if (local_a0 < item_width) {
        local_260 = 1;
        if ((window._4_4_ & 0x200000) != 0) {
          local_260 = 2;
        }
      }
      else {
        local_260 = 0;
      }
      PushItemWidth(item_width);
      for (local_190 = 0.0; (int)local_190 < (int)f[3]; local_190 = (float)((int)local_190 + 1)) {
        if (0 < (int)local_190) {
          SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
        }
        if ((float)((int)local_190 + 1) == f[3]) {
          PushItemWidth(fVar15);
        }
        if ((window._4_4_ & 0x1000000) == 0) {
          iVar9 = 0xff;
          if (bVar13) {
            iVar9 = 0;
          }
          bVar5 = DragInt(ids[(long)(int)local_190 + -1],(int *)(&w_item_one + (int)local_190),1.0,0
                          ,iVar9,fmt_table_float[(long)local_260 + 2][(long)(int)local_190 + 3]);
          label_local._7_1_ = label_local._7_1_ != false || bVar5;
        }
        else {
          local_264 = 0.0;
          if (!bVar13) {
            local_264 = 1.0;
          }
          bVar4 = DragFloat(ids[(long)(int)local_190 + -1],(float *)(i + (long)(int)local_190 + 2),
                            0.003921569,0.0,local_264,
                            *(char **)(&n + (long)local_260 * 8 + (long)(int)local_190 * 2),1.0);
          label_local._7_1_ = label_local._7_1_ != false || bVar4;
          bVar4 = label_local._7_1_;
        }
        if ((flags_00 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
      }
      PopItemWidth();
      PopItemWidth();
    }
    col_v4.z = 0.0;
    col_v4.w = 0.0;
    if ((flags_00 & 0x10) == 0) {
      if ((flags_00 & 0x20) == 0) {
        SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      }
      if (bVar12) {
        local_2b4 = col[3];
      }
      else {
        local_2b4 = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)auStack_1f8,*col,col[1],col[2],local_2b4);
      ImVec2::ImVec2(&local_200,0.0,0.0);
      bVar13 = ColorButton("##ColorButton",(ImVec4 *)auStack_1f8,flags_00,local_200);
      if ((bVar13) && ((flags_00 & 4) == 0)) {
        (pIVar3->ColorPickerRef).x = (float)auStack_1f8._0_4_;
        (pIVar3->ColorPickerRef).y = (float)auStack_1f8._4_4_;
        (pIVar3->ColorPickerRef).z = col_v4.x;
        (pIVar3->ColorPickerRef).w = col_v4.y;
        OpenPopup("picker");
        local_210 = ImRect::GetBL(&(pIVar10->DC).LastItemRect);
        ImVec2::ImVec2(&local_218,-1.0,(pIVar3->Style).ItemSpacing.y);
        local_208 = ::operator+(&local_210,&local_218);
        ImVec2::ImVec2((ImVec2 *)&picker_flags,0.0,0.0);
        SetNextWindowPos(&local_208,0,(ImVec2 *)&picker_flags);
      }
      if ((flags_00 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      bVar13 = BeginPopup("picker",0);
      if (bVar13) {
        col_v4._8_8_ = pIVar3->CurrentWindow;
        if (label != text_end) {
          TextUnformatted(label,text_end);
          Separator();
        }
        PushItemWidth(fVar14 * 12.0);
        bVar13 = ColorPicker4("##picker",col,flags & 0x7890002U | 0x740080,
                              &(pIVar3->ColorPickerRef).x);
        label_local._7_1_ = label_local._7_1_ != false || bVar13;
        PopItemWidth();
        EndPopup();
      }
    }
    if ((label != text_end) && ((flags_00 & 0x80) == 0)) {
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      TextUnformatted(label,text_end);
    }
    if (col_v4._8_8_ == 0) {
      if (!bVar4) {
        for (payload._4_4_ = 0; payload._4_4_ < 4; payload._4_4_ = payload._4_4_ + 1) {
          i[(long)payload._4_4_ + 2] = (int)((float)(int)(&w_item_one)[payload._4_4_] / 255.0);
        }
      }
      if ((window._4_4_ & 0x200000) != 0) {
        ColorConvertHSVtoRGB((float)i[2],(float)i[3],f[0],(float *)(i + 2),(float *)(i + 3),f);
      }
      if (label_local._7_1_ != false) {
        *col = (float)i[2];
        col[1] = (float)i[3];
        col[2] = f[0];
        if (bVar12) {
          col[3] = f[1];
        }
      }
    }
    PopID();
    EndGroup();
    if (((((pIVar10->DC).LastItemStatusFlags & 1U) != 0) && ((flags_00 & 0x200) == 0)) &&
       (bVar12 = BeginDragDropTarget(), bVar12)) {
      pIVar11 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar11 != (ImGuiPayload *)0x0) {
        puVar1 = (undefined8 *)pIVar11->Data;
        *(undefined8 *)col = *puVar1;
        col[2] = *(float *)(puVar1 + 1);
        label_local._7_1_ = true;
      }
      pIVar11 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar11 != (ImGuiPayload *)0x0) {
        memcpy(col,pIVar11->Data,(long)(int)f[3] << 2);
        label_local._7_1_ = true;
      }
      EndDragDropTarget();
    }
    if (((col_v4._8_8_ != 0) && (pIVar3->ActiveId != 0)) &&
       (pIVar3->ActiveIdWindow == (ImGuiWindow *)col_v4._8_8_)) {
      (pIVar10->DC).LastItemId = pIVar3->ActiveId;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ColorEdit4(const char* label, float col[4], ImGuiColorEditFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float square_sz = GetFrameHeight();
    const float w_extra = (flags & ImGuiColorEditFlags_NoSmallPreview) ? 0.0f : (square_sz + style.ItemInnerSpacing.x);
    const float w_items_all = CalcItemWidth() - w_extra;
    const char* label_display_end = FindRenderedTextEnd(label);

    BeginGroup();
    PushID(label);

    // If we're not showing any slider there's no point in doing any HSV conversions
    const ImGuiColorEditFlags flags_untouched = flags;
    if (flags & ImGuiColorEditFlags_NoInputs)
        flags = (flags & (~ImGuiColorEditFlags__InputsMask)) | ImGuiColorEditFlags_RGB | ImGuiColorEditFlags_NoOptions;

    // Context menu: display and modify options (before defaults are applied)
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorEditOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__InputsMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__InputsMask);
    if (!(flags & ImGuiColorEditFlags__DataTypeMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__DataTypeMask);
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__PickerMask);
    flags |= (g.ColorEditOptions & ~(ImGuiColorEditFlags__InputsMask | ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask));

    const bool alpha = (flags & ImGuiColorEditFlags_NoAlpha) == 0;
    const bool hdr = (flags & ImGuiColorEditFlags_HDR) != 0;
    const int components = alpha ? 4 : 3;

    // Convert to the formats we need
    float f[4] = { col[0], col[1], col[2], alpha ? col[3] : 1.0f };
    if (flags & ImGuiColorEditFlags_HSV)
        ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);
    int i[4] = { IM_F32_TO_INT8_UNBOUND(f[0]), IM_F32_TO_INT8_UNBOUND(f[1]), IM_F32_TO_INT8_UNBOUND(f[2]), IM_F32_TO_INT8_UNBOUND(f[3]) };

    bool value_changed = false;
    bool value_changed_as_float = false;

    if ((flags & (ImGuiColorEditFlags_RGB | ImGuiColorEditFlags_HSV)) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB/HSV 0..255 Sliders
        const float w_item_one  = ImMax(1.0f, (float)(int)((w_items_all - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
        const float w_item_last = ImMax(1.0f, (float)(int)(w_items_all - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));

        const bool hide_prefix = (w_item_one <= CalcTextSize((flags & ImGuiColorEditFlags_Float) ? "M:0.000" : "M:000").x);
        const char* ids[4] = { "##X", "##Y", "##Z", "##W" };
        const char* fmt_table_int[3][4] =
        {
            {   "%3d",   "%3d",   "%3d",   "%3d" }, // Short display
            { "R:%3d", "G:%3d", "B:%3d", "A:%3d" }, // Long display for RGBA
            { "H:%3d", "S:%3d", "V:%3d", "A:%3d" }  // Long display for HSVA
        };
        const char* fmt_table_float[3][4] =
        {
            {   "%0.3f",   "%0.3f",   "%0.3f",   "%0.3f" }, // Short display
            { "R:%0.3f", "G:%0.3f", "B:%0.3f", "A:%0.3f" }, // Long display for RGBA
            { "H:%0.3f", "S:%0.3f", "V:%0.3f", "A:%0.3f" }  // Long display for HSVA
        };
        const int fmt_idx = hide_prefix ? 0 : (flags & ImGuiColorEditFlags_HSV) ? 2 : 1;

        PushItemWidth(w_item_one);
        for (int n = 0; n < components; n++)
        {
            if (n > 0)
                SameLine(0, style.ItemInnerSpacing.x);
            if (n + 1 == components)
                PushItemWidth(w_item_last);
            if (flags & ImGuiColorEditFlags_Float)
                value_changed = value_changed_as_float = value_changed | DragFloat(ids[n], &f[n], 1.0f/255.0f, 0.0f, hdr ? 0.0f : 1.0f, fmt_table_float[fmt_idx][n]);
            else
                value_changed |= DragInt(ids[n], &i[n], 1.0f, 0, hdr ? 0 : 255, fmt_table_int[fmt_idx][n]);
            if (!(flags & ImGuiColorEditFlags_NoOptions))
                OpenPopupOnItemClick("context");
        }
        PopItemWidth();
        PopItemWidth();
    }
    else if ((flags & ImGuiColorEditFlags_HEX) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB Hexadecimal Input
        char buf[64];
        if (alpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", ImClamp(i[0],0,255), ImClamp(i[1],0,255), ImClamp(i[2],0,255), ImClamp(i[3],0,255));
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", ImClamp(i[0],0,255), ImClamp(i[1],0,255), ImClamp(i[2],0,255));
        PushItemWidth(w_items_all);
        if (InputText("##Text", buf, IM_ARRAYSIZE(buf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase))
        {
            value_changed = true;
            char* p = buf;
            while (*p == '#' || ImCharIsBlankA(*p))
                p++;
            i[0] = i[1] = i[2] = i[3] = 0;
            if (alpha)
                sscanf(p, "%02X%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2], (unsigned int*)&i[3]); // Treat at unsigned (%X is unsigned)
            else
                sscanf(p, "%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2]);
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
        PopItemWidth();
    }

    ImGuiWindow* picker_active_window = NULL;
    if (!(flags & ImGuiColorEditFlags_NoSmallPreview))
    {
        if (!(flags & ImGuiColorEditFlags_NoInputs))
            SameLine(0, style.ItemInnerSpacing.x);

        const ImVec4 col_v4(col[0], col[1], col[2], alpha ? col[3] : 1.0f);
        if (ColorButton("##ColorButton", col_v4, flags))
        {
            if (!(flags & ImGuiColorEditFlags_NoPicker))
            {
                // Store current color and open a picker
                g.ColorPickerRef = col_v4;
                OpenPopup("picker");
                SetNextWindowPos(window->DC.LastItemRect.GetBL() + ImVec2(-1,style.ItemSpacing.y));
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        if (BeginPopup("picker"))
        {
            picker_active_window = g.CurrentWindow;
            if (label != label_display_end)
            {
                TextUnformatted(label, label_display_end);
                Separator();
            }
            ImGuiColorEditFlags picker_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaBar;
            ImGuiColorEditFlags picker_flags = (flags_untouched & picker_flags_to_forward) | ImGuiColorEditFlags__InputsMask | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_AlphaPreviewHalf;
            PushItemWidth(square_sz * 12.0f); // Use 256 + bar sizes?
            value_changed |= ColorPicker4("##picker", col, picker_flags, &g.ColorPickerRef.x);
            PopItemWidth();
            EndPopup();
        }
    }

    if (label != label_display_end && !(flags & ImGuiColorEditFlags_NoLabel))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        TextUnformatted(label, label_display_end);
    }

    // Convert back
    if (picker_active_window == NULL)
    {
        if (!value_changed_as_float)
            for (int n = 0; n < 4; n++)
                f[n] = i[n] / 255.0f;
        if (flags & ImGuiColorEditFlags_HSV)
            ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
        if (value_changed)
        {
            col[0] = f[0];
            col[1] = f[1];
            col[2] = f[2];
            if (alpha)
                col[3] = f[3];
        }
    }

    PopID();
    EndGroup();

    // Drag and Drop Target
    // NB: The flag test is merely an optional micro-optimization, BeginDragDropTarget() does the same test.
    if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropTarget())
    {
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * 3);
            value_changed = true;
        }
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * components);
            value_changed = true;
        }
        EndDragDropTarget();
    }

    // When picker is being actively used, use its active id so IsItemActive() will function on ColorEdit4().
    if (picker_active_window && g.ActiveId != 0 && g.ActiveIdWindow == picker_active_window)
        window->DC.LastItemId = g.ActiveId;

    return value_changed;
}